

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  ostream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  __pid_t _Var4;
  TestRole TVar5;
  size_t sVar6;
  int *piVar7;
  long *plVar8;
  int (*paiVar9) [2];
  long *plVar10;
  size_type *psVar11;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  int aiVar13 [2];
  char *pcVar14;
  long lVar15;
  string local_140;
  int local_11c;
  string local_118;
  int local_f8;
  int local_f4;
  int pipe_fd [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  sVar6 = GetThreadCount();
  if (sVar6 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/build_O1/test/gtest/src/gtest/googletest/src/gtest-death-test.cc"
                       ,0x44e);
    Message::Message((Message *)&local_70);
    poVar1 = (ostream *)(local_70._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Death tests use fork(), which is unsafe particularly",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," in a threaded context. For this test, ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (sVar6 == 0) {
      lVar15 = 0x26;
      pcVar14 = "couldn\'t detect the number of threads.";
    }
    else {
      lVar15 = 9;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"detected ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar14 = " threads.";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar14,lVar15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,
               " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," for more explanation and suggested solutions, especially if",0x3c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1," this is the last message you see before your test times out.",0x3d);
    StringStreamToString(&local_50,local_70._M_head_impl);
    if (local_70._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))(local_70._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,local_50._M_dataplus._M_p,local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  iVar3 = pipe(&local_f8);
  if (iVar3 != -1) {
    paVar2 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
    fflush((FILE *)0x0);
    _Var4 = fork();
    if (_Var4 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var4;
      if (_Var4 == 0) {
        while( true ) {
          iVar3 = close(local_f8);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != 4) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"CHECK failed: File ","");
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_d0 = (long *)*plVar8;
            plVar10 = plVar8 + 2;
            if (local_d0 == plVar10) {
              local_c0 = *plVar10;
              lStack_b8 = plVar8[3];
              local_d0 = &local_c0;
            }
            else {
              local_c0 = *plVar10;
            }
            local_c8 = plVar8[1];
            *plVar8 = (long)plVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_b0._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
              local_b0.field_2._M_allocated_capacity = *psVar11;
              local_b0.field_2._8_8_ = plVar8[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar11;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_11c = 0x463;
            StreamableToString<int>(&local_140,&local_11c);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pipe_fd,&local_b0,&local_140);
            plVar8 = (long *)std::__cxx11::string::append((char *)pipe_fd);
            local_90._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
              local_90.field_2._M_allocated_capacity = *psVar11;
              local_90.field_2._8_8_ = plVar8[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar11;
            }
            local_90._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_70._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
            pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar8 + 2);
            if (local_70._M_head_impl == pbVar12) {
              local_60 = *(long *)pbVar12;
              lStack_58 = plVar8[3];
              local_70._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_60;
            }
            else {
              local_60 = *(long *)pbVar12;
            }
            local_68 = plVar8[1];
            *plVar8 = (long)pbVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_50._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
              local_50.field_2._M_allocated_capacity = *psVar11;
              local_50.field_2._8_8_ = plVar8[3];
              local_50._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_50.field_2._M_allocated_capacity = *psVar11;
            }
            local_50._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            DeathTestAbort(&local_50);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_f4;
        UnitTest::GetInstance();
        (((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_)->forwarding_enabled_ =
             false;
        g_in_fast_death_test_child = 1;
        TVar5 = EXECUTE_TEST;
      }
      else {
        while( true ) {
          iVar3 = close(local_f4);
          if (iVar3 != -1) break;
          piVar7 = __errno_location();
          if (*piVar7 != 4) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"CHECK failed: File ","");
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_d0 = (long *)*plVar8;
            plVar10 = plVar8 + 2;
            if (local_d0 == plVar10) {
              local_c0 = *plVar10;
              lStack_b8 = plVar8[3];
              local_d0 = &local_c0;
            }
            else {
              local_c0 = *plVar10;
            }
            local_c8 = plVar8[1];
            *plVar8 = (long)plVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
            local_b0._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
              local_b0.field_2._M_allocated_capacity = *psVar11;
              local_b0.field_2._8_8_ = plVar8[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar11;
            }
            local_b0._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_11c = 0x46f;
            StreamableToString<int>(&local_140,&local_11c);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pipe_fd,&local_b0,&local_140);
            plVar8 = (long *)std::__cxx11::string::append((char *)pipe_fd);
            local_90._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_90._M_dataplus._M_p == psVar11) {
              local_90.field_2._M_allocated_capacity = *psVar11;
              local_90.field_2._8_8_ = plVar8[3];
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = *psVar11;
            }
            local_90._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
            local_70._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
            pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (plVar8 + 2);
            if (local_70._M_head_impl == pbVar12) {
              local_60 = *(long *)pbVar12;
              lStack_58 = plVar8[3];
              local_70._M_head_impl =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_60;
            }
            else {
              local_60 = *(long *)pbVar12;
            }
            local_68 = plVar8[1];
            *plVar8 = (long)pbVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
            local_50._M_dataplus._M_p = (pointer)*plVar8;
            psVar11 = (size_type *)(plVar8 + 2);
            if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
              local_50.field_2._M_allocated_capacity = *psVar11;
              local_50.field_2._8_8_ = plVar8[3];
              local_50._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_50.field_2._M_allocated_capacity = *psVar11;
            }
            local_50._M_string_length = plVar8[1];
            *plVar8 = (long)psVar11;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            DeathTestAbort(&local_50);
          }
        }
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_f8;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar5 = OVERSEE_TEST;
      }
      return TVar5;
    }
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar8;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
      local_b0.field_2._M_allocated_capacity = *psVar11;
      local_b0.field_2._8_8_ = plVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar11;
    }
    local_b0._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_b0);
    pipe_fd = *paiVar9;
    aiVar13 = (int  [2])(paiVar9 + 2);
    if (pipe_fd == aiVar13) {
      local_e0._M_allocated_capacity = *(undefined8 *)aiVar13;
      local_e0._8_8_ = paiVar9[3];
      pipe_fd = (int  [2])&local_e0;
    }
    else {
      local_e0._M_allocated_capacity = *(undefined8 *)aiVar13;
    }
    *paiVar9 = aiVar13;
    paiVar9[1] = (int  [2])0x0;
    *(undefined1 *)paiVar9[2] = 0;
    local_140._M_dataplus._M_p._0_4_ = 0x460;
    StreamableToString<int>(&local_118,(int *)&local_140);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                   &local_118);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
    pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (plVar8 + 2);
    if (local_70._M_head_impl == pbVar12) {
      local_60 = *(long *)pbVar12;
      lStack_58 = plVar8[3];
      local_70._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
    }
    else {
      local_60 = *(long *)pbVar12;
    }
    local_68 = plVar8[1];
    *plVar8 = (long)pbVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_50._M_dataplus._M_p = (pointer)*plVar8;
    psVar11 = (size_type *)(plVar8 + 2);
    if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
      local_50.field_2._M_allocated_capacity = *psVar11;
      local_50.field_2._8_8_ = plVar8[3];
      local_50._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar11;
    }
    local_50._M_string_length = plVar8[1];
    *plVar8 = (long)psVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    DeathTestAbort(&local_50);
  }
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar8;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar11) {
    local_b0.field_2._M_allocated_capacity = *psVar11;
    local_b0.field_2._8_8_ = plVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar11;
  }
  local_b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_b0);
  pipe_fd = *paiVar9;
  aiVar13 = (int  [2])(paiVar9 + 2);
  if (pipe_fd == aiVar13) {
    local_e0._M_allocated_capacity = *(undefined8 *)aiVar13;
    local_e0._8_8_ = paiVar9[3];
    pipe_fd = (int  [2])&local_e0;
  }
  else {
    local_e0._M_allocated_capacity = *(undefined8 *)aiVar13;
  }
  *paiVar9 = aiVar13;
  paiVar9[1] = (int  [2])0x0;
  *(undefined1 *)paiVar9[2] = 0;
  local_140._M_dataplus._M_p._0_4_ = 0x452;
  StreamableToString<int>(&local_118,(int *)&local_140);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                 &local_118);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
  pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
  if (local_70._M_head_impl == pbVar12) {
    local_60 = *(long *)pbVar12;
    lStack_58 = plVar8[3];
    local_70._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  }
  else {
    local_60 = *(long *)pbVar12;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)pbVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50._M_dataplus._M_p = (pointer)*plVar8;
  psVar11 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar11) {
    local_50.field_2._M_allocated_capacity = *psVar11;
    local_50.field_2._8_8_ = plVar8[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar11;
  }
  local_50._M_string_length = plVar8[1];
  *plVar8 = (long)psVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  DeathTestAbort(&local_50);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}